

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,long,long,duckdb::BinaryNumericDivideWrapper,duckdb::DivideOperator,bool,false,false>
               (long *ldata,long *rdata,long *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long uVar1;
  bool bVar2;
  idx_t left;
  ValidityMask *mask_00;
  unsigned_long idx;
  long lVar3;
  unsigned_long in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  long rentry_2;
  long lentry_2;
  idx_t i;
  long rentry_1;
  long lentry_1;
  idx_t start;
  long rentry;
  long lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_ffffffffffffff60;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff68;
  ulong local_90;
  idx_t local_78;
  unsigned_long local_70;
  undefined8 local_68;
  undefined8 local_60;
  idx_t in_stack_ffffffffffffffa8;
  ValidityMask *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  ulong right;
  long in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  unsigned_long uVar4;
  ulong uVar5;
  
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RCX * 8),in_RDX,(void *)((long)in_RDX + in_RCX * 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  AssertRestrictFunction
            (in_RSI,(void *)((long)in_RSI + in_RCX * 8),in_RDX,(void *)((long)in_RDX + in_RCX * 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar2) {
    for (local_90 = 0; local_90 < in_RCX; local_90 = local_90 + 1) {
      lVar3 = BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,long,long,long>
                        (SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0),in_stack_ffffffffffffffc0
                         ,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8);
      *(long *)((long)in_RDX + local_90 * 8) = lVar3;
    }
  }
  else {
    uVar4 = 0;
    left = TemplatedValidityMask<unsigned_long>::EntryCount(0x133e793);
    for (right = 0; right < left; right = right + 1) {
      mask_00 = (ValidityMask *)
                TemplatedValidityMask<unsigned_long>::GetValidityEntry
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      idx = MinValue<unsigned_long>(uVar4 + 0x40,in_RCX);
      bVar2 = TemplatedValidityMask<unsigned_long>::AllValid((unsigned_long)mask_00);
      if (bVar2) {
        for (; uVar5 = uVar4, uVar4 < idx; uVar4 = uVar4 + 1) {
          local_60 = *(undefined8 *)((long)in_RDI + uVar4 * 8);
          local_68 = *(undefined8 *)((long)in_RSI + uVar4 * 8);
          lVar3 = BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,long,long,long>
                            (SUB81(uVar4 >> 0x38,0),left,right,mask_00,idx);
          *(long *)((long)in_RDX + uVar4 * 8) = lVar3;
        }
      }
      else {
        bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid((unsigned_long)mask_00);
        uVar1 = uVar4;
        uVar5 = idx;
        if (!bVar2) {
          for (; local_70 = uVar1, uVar5 = uVar4, uVar4 < idx; uVar4 = uVar4 + 1) {
            local_78 = uVar4 - local_70;
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              ((unsigned_long *)&stack0xffffffffffffffb0,&local_78);
            if (bVar2) {
              lVar3 = BinaryNumericDivideWrapper::
                      Operation<bool,duckdb::DivideOperator,long,long,long>
                                (SUB81(uVar4 >> 0x38,0),left,right,mask_00,idx);
              *(long *)((long)in_RDX + uVar4 * 8) = lVar3;
            }
            uVar1 = local_70;
          }
        }
      }
      uVar4 = uVar5;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}